

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

NondegeneracyCheckResult * __thiscall
slang::ast::SequenceWithMatchExpr::checkNondegeneracyImpl(SequenceWithMatchExpr *this)

{
  bool bVar1;
  NondegeneracyCheckResult *in_RDI;
  NondegeneracyCheckResult result;
  NondegeneracyCheckResult *in_stack_ffffffffffffff78;
  NondegeneracyCheckResult *this_00;
  SequenceRepetition *in_stack_ffffffffffffffa0;
  
  this_00 = in_RDI;
  AssertionExpr::NondegeneracyCheckResult::NondegeneracyCheckResult(in_RDI);
  bVar1 = std::optional::operator_cast_to_bool((optional<slang::ast::SequenceRepetition> *)0x9d29de)
  ;
  if (bVar1) {
    std::optional<slang::ast::SequenceRepetition>::operator->
              ((optional<slang::ast::SequenceRepetition> *)0x9d29f2);
    SequenceRepetition::checkNondegeneracy(in_stack_ffffffffffffffa0);
  }
  AssertionExpr::checkNondegeneracy((AssertionExpr *)this_00);
  AssertionExpr::NondegeneracyCheckResult::operator|(this_00,in_stack_ffffffffffffff78);
  return in_RDI;
}

Assistant:

AssertionExpr::NondegeneracyCheckResult SequenceWithMatchExpr::checkNondegeneracyImpl() const {
    NondegeneracyCheckResult result;
    if (repetition)
        result = repetition->checkNondegeneracy();

    return result | expr.checkNondegeneracy();
}